

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

SDL12_CDstatus SDL_CDStatus(SDL12_CD *cdrom)

{
  int iVar1;
  AudioCallbackWrapperData *pAVar2;
  SDL12_CD *pSVar3;
  SDL12_CDstatus SVar4;
  
  pSVar3 = ValidCDDevice(cdrom);
  if (pSVar3 == (SDL12_CD *)0x0) {
    SVar4 = SDL12_CD_ERROR;
  }
  else {
    (*SDL20_LockAudio)();
    pAVar2 = audio_cbdata;
    if (audio_cbdata == (AudioCallbackWrapperData *)0x0) {
      SVar4 = pSVar3->status;
    }
    else {
      SVar4 = audio_cbdata->cdrom_status;
      pSVar3->status = SVar4;
      iVar1 = pAVar2->cdrom_cur_frame;
      pSVar3->cur_track = pAVar2->cdrom_cur_track;
      pSVar3->cur_frame = iVar1;
    }
    (*SDL20_UnlockAudio)();
  }
  return SVar4;
}

Assistant:

SDLCALL
SDL_CDStatus(SDL12_CD *cdrom)
{
    SDL12_CDstatus retval;

    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return SDL12_CD_ERROR;
    }

    SDL20_LockAudio();  /* we update this during the audio callback. */
    if (audio_cbdata) {
        cdrom->status = audio_cbdata->cdrom_status;
        cdrom->cur_track = audio_cbdata->cdrom_cur_track;
        cdrom->cur_frame = audio_cbdata->cdrom_cur_frame;
    }
    retval = cdrom->status;
    SDL20_UnlockAudio();

    return retval;
}